

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O1

void __thiscall
QMenuBarPrivate::setCurrentAction
          (QMenuBarPrivate *this,QAction *action,bool popup,bool activateFirst)

{
  QWidget *this_00;
  Data *pDVar1;
  char cVar2;
  QAction *pQVar3;
  QWidget *pQVar4;
  Data *pDVar5;
  QWidget *this_01;
  long in_FS_OFFSET;
  bool bVar6;
  QStatusTipEvent tip;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->currentAction).wp.d;
  if ((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) {
    pQVar3 = (QAction *)0x0;
  }
  else {
    pQVar3 = (QAction *)(this->currentAction).wp.value;
  }
  if ((pQVar3 == action) && (((this->field_0x2a0 ^ popup) & 1) == 0)) goto LAB_0046caef;
  QBasicTimer::stop();
  if (popup) {
    pDVar5 = (this->activeMenu).wp.d;
    bVar6 = true;
    if ((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) {
      bVar6 = (this->activeMenu).wp.value == (QObject *)0x0;
    }
  }
  else {
    bVar6 = false;
  }
  this->doChildEffects = bVar6;
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pDVar5 = (this->activeMenu).wp.d;
  if ((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) {
    this_01 = (QWidget *)0x0;
  }
  else {
    this_01 = (QWidget *)(this->activeMenu).wp.value;
  }
  if (this_01 == (QWidget *)0x0) {
    pQVar4 = (QWidget *)0x0;
  }
  else {
    (this->activeMenu).wp.d = (Data *)0x0;
    (this->activeMenu).wp.value = (QObject *)0x0;
    if (pDVar5 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar5 = *(int *)pDVar5 + -1;
      UNLOCK();
      if (*(int *)pDVar5 == 0) {
        operator_delete(pDVar5);
      }
    }
    if (popup) {
      pQVar4 = QWidget::window(this_00);
      pQVar4 = QWidget::focusWidget(pQVar4);
      QWidget::setFocus(this_00,NoFocusReason);
    }
    else {
      pQVar4 = (QWidget *)0x0;
    }
    QWidget::hide(this_01);
  }
  pDVar5 = (this->currentAction).wp.d;
  if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
     ((this->currentAction).wp.value != (QObject *)0x0)) {
    if ((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) {
      pQVar3 = (QAction *)0x0;
    }
    else {
      pQVar3 = (QAction *)(this->currentAction).wp.value;
    }
    local_88 = (undefined1  [16])actionRect(this,pQVar3);
    QWidget::update(this_00,(QRect *)local_88);
  }
  this->field_0x2a0 = this->field_0x2a0 & 0xfe | popup;
  pDVar5 = (this->currentAction).wp.d;
  bVar6 = true;
  if ((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) {
    bVar6 = (this->currentAction).wp.value == (QObject *)0x0;
  }
  if (action == (QAction *)0x0) {
    pDVar5 = (Data *)0x0;
  }
  else {
    pDVar5 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)action);
  }
  pDVar1 = (this->currentAction).wp.d;
  (this->currentAction).wp.d = pDVar5;
  (this->currentAction).wp.value = (QObject *)action;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      operator_delete(pDVar1);
    }
  }
  if (action == (QAction *)0x0) {
LAB_0046ca63:
    if (!bVar6) {
      local_58 = (QArrayData *)0x0;
      uStack_50 = 0;
      local_48 = 0;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStatusTipEvent::QStatusTipEvent((QStatusTipEvent *)local_88,(QString *)&local_58);
      QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)local_88);
      QStatusTipEvent::~QStatusTipEvent((QStatusTipEvent *)local_88);
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,2,0x10);
        }
      }
    }
  }
  else {
    cVar2 = QAction::isEnabled();
    if (cVar2 == '\0') goto LAB_0046ca63;
    activateAction(this,action,Hover);
    if (popup) {
      popupAction(this,action,activateFirst);
    }
    local_88 = (undefined1  [16])actionRect(this,action);
    QWidget::update(this_00,(QRect *)local_88);
  }
  if (pQVar4 != (QWidget *)0x0) {
    QWidget::setFocus(pQVar4,NoFocusReason);
  }
LAB_0046caef:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuBarPrivate::setCurrentAction(QAction *action, bool popup, bool activateFirst)
{
    if (currentAction == action && popup == popupState)
        return;

    autoReleaseTimer.stop();

    doChildEffects = (popup && !activeMenu);
    Q_Q(QMenuBar);
    QWidget *fw = nullptr;
    if (QMenu *menu = activeMenu) {
        activeMenu = nullptr;
        if (popup) {
            fw = q->window()->focusWidget();
            q->setFocus(Qt::NoFocusReason);
        }
        menu->hide();
    }

    if (currentAction)
        q->update(actionRect(currentAction));

    popupState = popup;
#if QT_CONFIG(statustip)
    QAction *previousAction = currentAction;
#endif
    currentAction = action;
    if (action && action->isEnabled()) {
        activateAction(action, QAction::Hover);
        if (popup)
            popupAction(action, activateFirst);
        q->update(actionRect(action));
#if QT_CONFIG(statustip)
    }  else if (previousAction) {
        QString empty;
        QStatusTipEvent tip(empty);
        QCoreApplication::sendEvent(q, &tip);
#endif
    }
    if (fw)
        fw->setFocus(Qt::NoFocusReason);
}